

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O2

bool DecodeBase58Check(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                      int max_ret)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  int max_ret_len;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  string_view str_00;
  uint256 hash;
  Span<unsigned_char> local_58;
  uint256 local_48;
  long local_28;
  
  str_00._M_str._4_4_ = in_register_00000014;
  str_00._M_str._0_4_ = max_ret;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  str_00._M_len = (size_t)(str->_M_dataplus)._M_p;
  bVar3 = util::ContainsNoNUL((util *)str->_M_string_length,str_00);
  if (bVar3) {
    max_ret_len = 0x7fffffff;
    if (max_ret < 0x7ffffffc) {
      max_ret_len = max_ret + 4;
    }
    bVar3 = DecodeBase58((str->_M_dataplus)._M_p,vchRet,max_ret_len);
    puVar1 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((bVar3) && (uVar4 = (long)puVar2 - (long)puVar1, 3 < uVar4)) {
      local_58.m_size = uVar4 - 4;
      local_58.m_data = puVar1;
      Hash<Span<unsigned_char>>(&local_48,&local_58);
      puVar1 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar3 = local_48.super_base_blob<256U>.m_data._M_elems._0_4_ == *(int *)(puVar2 + -4);
      if (bVar3) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (vchRet,(size_type)(puVar2 + (-4 - (long)puVar1)));
      }
      else if (puVar2 != puVar1) {
        (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
      goto LAB_005523ce;
    }
    if (puVar2 != puVar1) {
      (vchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
  }
  bVar3 = false;
LAB_005523ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58Check(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58Check(str.c_str(), vchRet, max_ret);
}